

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_257,_false,_embree::avx512::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  byte bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  char cVar23;
  byte bVar24;
  bool bVar25;
  ulong uVar26;
  ulong *puVar27;
  long lVar28;
  NodeRef root;
  uint uVar29;
  undefined1 (*pauVar30) [32];
  byte bVar31;
  undefined4 uVar32;
  byte bVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar38 [16];
  int iVar37;
  int iVar51;
  int iVar52;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar39 [16];
  undefined1 auVar42 [32];
  int iVar53;
  int iVar57;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 in_ZMM1 [64];
  float fVar60;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar61 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 in_ZMM4 [64];
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar72 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  vfloat4 a0;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  uint local_2a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29e0;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [8];
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  undefined4 uStack_2924;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  bvh = (BVH *)This->ptr;
  sVar1 = (bvh->root).ptr;
  if (sVar1 != 8) {
    auVar44 = *(undefined1 (*) [32])(ray + 0x100);
    auVar41 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar34 = vcmpps_avx512vl(auVar44,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar26 = vpcmpeqd_avx512vl(auVar41,(undefined1  [32])valid_i->field_0);
    uVar34 = uVar34 & uVar26;
    bVar33 = (byte)uVar34;
    if (bVar33 != 0) {
      local_2980 = *(undefined1 (*) [32])(ray + 0x80);
      local_2960 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_2940 = *(undefined1 (*) [32])(ray + 0xc0);
      fVar8 = local_2940._0_4_;
      auVar87._0_4_ = fVar8 * fVar8;
      fVar60 = local_2940._4_4_;
      auVar87._4_4_ = fVar60 * fVar60;
      fVar62 = local_2940._8_4_;
      auVar87._8_4_ = fVar62 * fVar62;
      fVar63 = local_2940._12_4_;
      auVar87._12_4_ = fVar63 * fVar63;
      fVar64 = local_2940._16_4_;
      auVar87._16_4_ = fVar64 * fVar64;
      fVar65 = local_2940._20_4_;
      auVar87._20_4_ = fVar65 * fVar65;
      fVar66 = local_2940._24_4_;
      auVar87._28_36_ = in_ZMM4._28_36_;
      auVar87._24_4_ = fVar66 * fVar66;
      auVar81 = vfmadd231ps_fma(auVar87._0_32_,local_2960,local_2960);
      auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_2980,local_2980);
      auVar40 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
      auVar41._8_4_ = 0xbf000000;
      auVar41._0_8_ = 0xbf000000bf000000;
      auVar41._12_4_ = 0xbf000000;
      auVar41._16_4_ = 0xbf000000;
      auVar41._20_4_ = 0xbf000000;
      auVar41._24_4_ = 0xbf000000;
      auVar41._28_4_ = 0xbf000000;
      auVar41 = vmulps_avx512vl(ZEXT1632(auVar81),auVar41);
      fVar67 = auVar40._0_4_;
      fVar75 = auVar40._4_4_;
      fVar76 = auVar40._8_4_;
      fVar77 = auVar40._12_4_;
      fVar78 = auVar40._16_4_;
      fVar79 = auVar40._20_4_;
      fVar80 = auVar40._24_4_;
      auVar81._0_4_ = fVar67 * fVar67;
      auVar81._4_4_ = fVar75 * fVar75;
      auVar81._8_4_ = fVar76 * fVar76;
      auVar81._12_4_ = fVar77 * fVar77;
      auVar43._4_4_ = auVar81._4_4_ * fVar75 * auVar41._4_4_;
      auVar43._0_4_ = auVar81._0_4_ * fVar67 * auVar41._0_4_;
      auVar43._8_4_ = auVar81._8_4_ * fVar76 * auVar41._8_4_;
      auVar43._12_4_ = auVar81._12_4_ * fVar77 * auVar41._12_4_;
      auVar43._16_4_ = fVar78 * fVar78 * fVar78 * auVar41._16_4_;
      auVar43._20_4_ = fVar79 * fVar79 * fVar79 * auVar41._20_4_;
      auVar43._24_4_ = fVar80 * fVar80 * fVar80 * auVar41._24_4_;
      auVar43._28_4_ = auVar41._28_4_;
      auVar42._8_4_ = 0x3fc00000;
      auVar42._0_8_ = 0x3fc000003fc00000;
      auVar42._12_4_ = 0x3fc00000;
      auVar42._16_4_ = 0x3fc00000;
      auVar42._20_4_ = 0x3fc00000;
      auVar42._24_4_ = 0x3fc00000;
      auVar42._28_4_ = 0x3fc00000;
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar43,auVar40,auVar42);
      auVar69._8_4_ = 0x80000000;
      auVar69._0_8_ = 0x8000000080000000;
      auVar69._12_4_ = 0x80000000;
      auVar72._12_4_ = 0;
      auVar72._0_12_ = ZEXT812(0);
      auVar72 = auVar72 << 0x20;
      auVar81 = vpcmpeqd_avx(auVar81,auVar81);
      uVar26 = uVar34;
      while (uVar26 != 0) {
        lVar28 = 0;
        for (uVar36 = uVar26; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
          lVar28 = lVar28 + 1;
        }
        uVar26 = uVar26 - 1 & uVar26;
        uVar36 = (ulong)(uint)((int)lVar28 * 4);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar36 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar36 + 0xa0)),0x1c);
        auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + uVar36 + 0xc0)),0x28);
        fVar67 = *(float *)((long)&local_27c0 + uVar36);
        auVar88._0_4_ = auVar38._0_4_ * fVar67;
        auVar88._4_4_ = auVar38._4_4_ * fVar67;
        auVar88._8_4_ = auVar38._8_4_ * fVar67;
        auVar88._12_4_ = auVar38._12_4_ * fVar67;
        auVar89 = vshufpd_avx(auVar88,auVar88,1);
        auVar38 = vmovshdup_avx(auVar88);
        auVar39 = vunpckhps_avx(auVar88,auVar72);
        auVar91 = vshufps_avx(auVar39,ZEXT416(auVar38._0_4_ ^ 0x80000000),0x41);
        auVar39._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
        auVar39._8_8_ = auVar89._8_8_ ^ auVar69._8_8_;
        auVar38 = vdpps_avx(auVar91,auVar91,0x7f);
        auVar39 = vinsertps_avx(auVar39,auVar88,0x2a);
        auVar89 = vdpps_avx(auVar39,auVar39,0x7f);
        uVar9 = vcmpps_avx512vl(auVar89,auVar38,1);
        auVar38 = vpmovm2d_avx512vl(uVar9);
        auVar95._0_4_ = auVar38._0_4_;
        auVar95._4_4_ = auVar95._0_4_;
        auVar95._8_4_ = auVar95._0_4_;
        auVar95._12_4_ = auVar95._0_4_;
        uVar36 = vpmovd2m_avx512vl(auVar95);
        auVar38._4_4_ = (uint)((byte)(uVar36 >> 1) & 1) * auVar81._4_4_;
        auVar38._0_4_ = (uint)((byte)uVar36 & 1) * auVar81._0_4_;
        auVar38._8_4_ = (uint)((byte)(uVar36 >> 2) & 1) * auVar81._8_4_;
        auVar38._12_4_ = (uint)((byte)(uVar36 >> 3) & 1) * auVar81._12_4_;
        auVar38 = vblendvps_avx(auVar39,auVar91,auVar38);
        auVar89 = vdpps_avx(auVar38,auVar38,0x7f);
        auVar39 = vrsqrt14ss_avx512f(auVar72,ZEXT416((uint)auVar89._0_4_));
        fVar75 = auVar39._0_4_;
        fVar75 = fVar75 * 1.5 - auVar89._0_4_ * 0.5 * fVar75 * fVar75 * fVar75;
        auVar91._0_4_ = auVar38._0_4_ * fVar75;
        auVar91._4_4_ = auVar38._4_4_ * fVar75;
        auVar91._8_4_ = auVar38._8_4_ * fVar75;
        auVar91._12_4_ = auVar38._12_4_ * fVar75;
        auVar38 = vshufps_avx(auVar91,auVar91,0xc9);
        auVar89 = vshufps_avx(auVar88,auVar88,0xc9);
        auVar96._0_4_ = auVar91._0_4_ * auVar89._0_4_;
        auVar96._4_4_ = auVar91._4_4_ * auVar89._4_4_;
        auVar96._8_4_ = auVar91._8_4_ * auVar89._8_4_;
        auVar96._12_4_ = auVar91._12_4_ * auVar89._12_4_;
        auVar38 = vfmsub231ps_fma(auVar96,auVar88,auVar38);
        auVar89 = vshufps_avx(auVar38,auVar38,0xc9);
        auVar38 = vdpps_avx(auVar89,auVar89,0x7f);
        auVar39 = vrsqrt14ss_avx512f(auVar72,ZEXT416((uint)auVar38._0_4_));
        fVar75 = auVar39._0_4_;
        fVar75 = fVar75 * 1.5 - auVar38._0_4_ * 0.5 * fVar75 * fVar75 * fVar75;
        auVar93._0_4_ = fVar75 * auVar89._0_4_;
        auVar93._4_4_ = fVar75 * auVar89._4_4_;
        auVar93._8_4_ = fVar75 * auVar89._8_4_;
        auVar93._12_4_ = fVar75 * auVar89._12_4_;
        auVar89._0_4_ = fVar67 * auVar88._0_4_;
        auVar89._4_4_ = fVar67 * auVar88._4_4_;
        auVar89._8_4_ = fVar67 * auVar88._8_4_;
        auVar89._12_4_ = fVar67 * auVar88._12_4_;
        auVar39 = vunpcklps_avx(auVar91,auVar89);
        auVar38 = vunpckhps_avx(auVar91,auVar89);
        auVar91 = vunpcklps_avx(auVar93,auVar72);
        auVar89 = vunpckhps_avx(auVar93,auVar72);
        auVar89 = vunpcklps_avx(auVar38,auVar89);
        in_ZMM9 = ZEXT1664(auVar89);
        auVar88 = vunpcklps_avx(auVar39,auVar91);
        auVar38 = vunpckhps_avx(auVar39,auVar91);
        lVar28 = lVar28 * 0x30;
        *(undefined1 (*) [16])(local_27a0 + lVar28) = auVar88;
        *(undefined1 (*) [16])(auStack_2790 + lVar28) = auVar38;
        *(undefined1 (*) [16])(auStack_2780 + lVar28) = auVar89;
      }
      local_29e0._0_4_ = *(undefined4 *)ray;
      local_29e0._4_4_ = *(undefined4 *)(ray + 4);
      local_29e0._8_4_ = *(undefined4 *)(ray + 8);
      local_29e0._12_4_ = *(undefined4 *)(ray + 0xc);
      local_29e0._16_4_ = *(undefined4 *)(ray + 0x10);
      local_29e0._20_4_ = *(undefined4 *)(ray + 0x14);
      local_29e0._24_4_ = *(undefined4 *)(ray + 0x18);
      local_29e0._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_29e0._32_4_ = *(undefined4 *)(ray + 0x20);
      local_29e0._36_4_ = *(undefined4 *)(ray + 0x24);
      local_29e0._40_4_ = *(undefined4 *)(ray + 0x28);
      local_29e0._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_29e0._48_4_ = *(undefined4 *)(ray + 0x30);
      local_29e0._52_4_ = *(undefined4 *)(ray + 0x34);
      local_29e0._56_4_ = *(undefined4 *)(ray + 0x38);
      local_29e0._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_29e0._64_4_ = *(undefined4 *)(ray + 0x40);
      local_29e0._68_4_ = *(undefined4 *)(ray + 0x44);
      local_29e0._72_4_ = *(undefined4 *)(ray + 0x48);
      local_29e0._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_29e0._80_4_ = *(undefined4 *)(ray + 0x50);
      local_29e0._84_4_ = *(undefined4 *)(ray + 0x54);
      local_29e0._88_4_ = *(undefined4 *)(ray + 0x58);
      local_29e0._92_4_ = *(undefined4 *)(ray + 0x5c);
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar97 = ZEXT3264(auVar41);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar98 = ZEXT3264(auVar42);
      vandps_avx512vl(local_2980,auVar41);
      uVar26 = vcmpps_avx512vl(auVar42,auVar42,1);
      bVar25 = (bool)((byte)uVar26 & 1);
      iVar37 = auVar42._0_4_;
      auVar40._0_4_ = (uint)bVar25 * iVar37 | (uint)!bVar25 * local_2980._0_4_;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      iVar51 = auVar42._4_4_;
      auVar40._4_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * local_2980._4_4_;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      iVar52 = auVar42._8_4_;
      auVar40._8_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * local_2980._8_4_;
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      iVar53 = auVar42._12_4_;
      auVar40._12_4_ = (uint)bVar25 * iVar53 | (uint)!bVar25 * local_2980._12_4_;
      bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
      iVar54 = auVar42._16_4_;
      auVar40._16_4_ = (uint)bVar25 * iVar54 | (uint)!bVar25 * local_2980._16_4_;
      bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
      iVar55 = auVar42._20_4_;
      auVar40._20_4_ = (uint)bVar25 * iVar55 | (uint)!bVar25 * local_2980._20_4_;
      bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
      iVar56 = auVar42._24_4_;
      iVar57 = auVar42._28_4_;
      auVar40._24_4_ = (uint)bVar25 * iVar56 | (uint)!bVar25 * local_2980._24_4_;
      bVar25 = SUB81(uVar26 >> 7,0);
      auVar40._28_4_ = (uint)bVar25 * iVar57 | (uint)!bVar25 * local_2980._28_4_;
      vandps_avx512vl(local_2960,auVar41);
      uVar26 = vcmpps_avx512vl(auVar40,auVar42,1);
      bVar25 = (bool)((byte)uVar26 & 1);
      auVar45._0_4_ = (uint)bVar25 * iVar37 | (uint)!bVar25 * local_2960._0_4_;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar45._4_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * local_2960._4_4_;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar45._8_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * local_2960._8_4_;
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar45._12_4_ = (uint)bVar25 * iVar53 | (uint)!bVar25 * local_2960._12_4_;
      bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
      auVar45._16_4_ = (uint)bVar25 * iVar54 | (uint)!bVar25 * local_2960._16_4_;
      bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
      auVar45._20_4_ = (uint)bVar25 * iVar55 | (uint)!bVar25 * local_2960._20_4_;
      bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
      auVar45._24_4_ = (uint)bVar25 * iVar56 | (uint)!bVar25 * local_2960._24_4_;
      bVar25 = SUB81(uVar26 >> 7,0);
      auVar45._28_4_ = (uint)bVar25 * iVar57 | (uint)!bVar25 * local_2960._28_4_;
      vandps_avx512vl(_local_2940,auVar41);
      uVar26 = vcmpps_avx512vl(auVar45,auVar42,1);
      bVar25 = (bool)((byte)uVar26 & 1);
      auVar50._0_4_ = (uint)bVar25 * iVar37 | (uint)!bVar25 * (int)fVar8;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * (int)fVar60;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * (int)fVar62;
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar25 * iVar53 | (uint)!bVar25 * (int)fVar63;
      bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
      auVar50._16_4_ = (uint)bVar25 * iVar54 | (uint)!bVar25 * (int)fVar64;
      bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
      auVar50._20_4_ = (uint)bVar25 * iVar55 | (uint)!bVar25 * (int)fVar65;
      bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
      auVar50._24_4_ = (uint)bVar25 * iVar56 | (uint)!bVar25 * (int)fVar66;
      bVar25 = SUB81(uVar26 >> 7,0);
      auVar50._28_4_ = (uint)bVar25 * iVar57 | (uint)!bVar25 * local_2940._28_4_;
      auVar41 = vrcp14ps_avx512vl(auVar40);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar99 = ZEXT3264(auVar42);
      auVar38 = ZEXT816(0);
      auVar87 = ZEXT1664(auVar38);
      auVar43 = vfnmadd213ps_avx512vl(auVar40,auVar41,auVar42);
      auVar81 = vfmadd132ps_fma(auVar43,auVar41,auVar41);
      auVar41 = vrcp14ps_avx512vl(auVar45);
      auVar43 = vfnmadd213ps_avx512vl(auVar45,auVar41,auVar42);
      auVar72 = vfmadd132ps_fma(auVar43,auVar41,auVar41);
      auVar41 = vrcp14ps_avx512vl(auVar50);
      auVar42 = vfnmadd213ps_avx512vl(auVar50,auVar41,auVar42);
      local_2920 = ZEXT1632(auVar81);
      local_2900 = ZEXT1632(auVar72);
      auVar69 = vfmadd132ps_fma(auVar42,auVar41,auVar41);
      local_28e0 = ZEXT1632(auVar69);
      local_28c0._4_4_ = (float)local_29e0._4_4_ * auVar81._4_4_;
      local_28c0._0_4_ = (float)local_29e0._0_4_ * auVar81._0_4_;
      local_28c0._8_4_ = (float)local_29e0._8_4_ * auVar81._8_4_;
      local_28c0._12_4_ = (float)local_29e0._12_4_ * auVar81._12_4_;
      local_28c0._16_4_ = (float)local_29e0._16_4_ * 0.0;
      local_28c0._20_4_ = (float)local_29e0._20_4_ * 0.0;
      local_28c0._24_4_ = (float)local_29e0._24_4_ * 0.0;
      local_28c0._28_4_ = local_29e0._28_4_;
      local_28a0._4_4_ = (float)local_29e0._36_4_ * auVar72._4_4_;
      local_28a0._0_4_ = (float)local_29e0._32_4_ * auVar72._0_4_;
      local_28a0._8_4_ = (float)local_29e0._40_4_ * auVar72._8_4_;
      local_28a0._12_4_ = (float)local_29e0._44_4_ * auVar72._12_4_;
      local_28a0._16_4_ = (float)local_29e0._48_4_ * 0.0;
      local_28a0._20_4_ = (float)local_29e0._52_4_ * 0.0;
      local_28a0._24_4_ = (float)local_29e0._56_4_ * 0.0;
      local_28a0._28_4_ = local_29e0._60_4_;
      local_2880._4_4_ = (float)local_29e0._68_4_ * auVar69._4_4_;
      local_2880._0_4_ = (float)local_29e0._64_4_ * auVar69._0_4_;
      local_2880._8_4_ = (float)local_29e0._72_4_ * auVar69._8_4_;
      local_2880._12_4_ = (float)local_29e0._76_4_ * auVar69._12_4_;
      local_2880._16_4_ = (float)local_29e0._80_4_ * 0.0;
      local_2880._20_4_ = (float)local_29e0._84_4_ * 0.0;
      local_2880._24_4_ = (float)local_29e0._88_4_ * 0.0;
      local_2880._28_4_ = local_29e0._92_4_;
      uVar26 = vcmpps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar38),1);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2860._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar41._4_4_;
      local_2860._0_4_ = (uint)((byte)uVar26 & 1) * auVar41._0_4_;
      local_2860._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar41._8_4_;
      local_2860._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar41._12_4_;
      local_2860._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * auVar41._16_4_;
      local_2860._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * auVar41._20_4_;
      local_2860._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * auVar41._24_4_;
      local_2860._28_4_ = (uint)(byte)(uVar26 >> 7) * auVar41._28_4_;
      uVar26 = vcmpps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar38),5);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar25 = (bool)((byte)uVar26 & 1);
      local_2840 = (uint)bVar25 * auVar41._0_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      uStack_283c = (uint)bVar25 * auVar41._4_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      uStack_2838 = (uint)bVar25 * auVar41._8_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      uStack_2834 = (uint)bVar25 * auVar41._12_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
      uStack_2830 = (uint)bVar25 * auVar41._16_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
      uStack_282c = (uint)bVar25 * auVar41._20_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
      uStack_2828 = (uint)bVar25 * auVar41._24_4_ | (uint)!bVar25 * 0x30;
      bVar25 = SUB81(uVar26 >> 7,0);
      uStack_2824 = (uint)bVar25 * auVar41._28_4_ | (uint)!bVar25 * 0x30;
      auVar42 = ZEXT1632(auVar38);
      uVar26 = vcmpps_avx512vl(ZEXT1632(auVar69),auVar42,5);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar25 = (bool)((byte)uVar26 & 1);
      local_2820 = (uint)bVar25 * auVar41._0_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      uStack_281c = (uint)bVar25 * auVar41._4_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      uStack_2818 = (uint)bVar25 * auVar41._8_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      uStack_2814 = (uint)bVar25 * auVar41._12_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 4) & 1);
      uStack_2810 = (uint)bVar25 * auVar41._16_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 5) & 1);
      uStack_280c = (uint)bVar25 * auVar41._20_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 6) & 1);
      uStack_2808 = (uint)bVar25 * auVar41._24_4_ | (uint)!bVar25 * 0x50;
      bVar25 = SUB81(uVar26 >> 7,0);
      uStack_2804 = (uint)bVar25 * auVar41._28_4_ | (uint)!bVar25 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar100 = ZEXT3264(local_1e80);
      auVar41 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar42);
      local_2800._0_4_ =
           (uint)(bVar33 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar33 & 1) * local_1e80._0_4_;
      bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
      local_2800._4_4_ = (uint)bVar25 * auVar41._4_4_ | (uint)!bVar25 * local_1e80._4_4_;
      bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
      local_2800._8_4_ = (uint)bVar25 * auVar41._8_4_ | (uint)!bVar25 * local_1e80._8_4_;
      bVar25 = (bool)((byte)(uVar34 >> 3) & 1);
      local_2800._12_4_ = (uint)bVar25 * auVar41._12_4_ | (uint)!bVar25 * local_1e80._12_4_;
      bVar25 = (bool)((byte)(uVar34 >> 4) & 1);
      local_2800._16_4_ = (uint)bVar25 * auVar41._16_4_ | (uint)!bVar25 * local_1e80._16_4_;
      bVar25 = (bool)((byte)(uVar34 >> 5) & 1);
      local_2800._20_4_ = (uint)bVar25 * auVar41._20_4_ | (uint)!bVar25 * local_1e80._20_4_;
      bVar25 = (bool)((byte)(uVar34 >> 6) & 1);
      local_2800._24_4_ = (uint)bVar25 * auVar41._24_4_ | (uint)!bVar25 * local_1e80._24_4_;
      bVar25 = SUB81(uVar34 >> 7,0);
      local_2800._28_4_ = (uint)bVar25 * auVar41._28_4_ | (uint)!bVar25 * local_1e80._28_4_;
      auVar44 = vmaxps_avx512vl(auVar44,auVar42);
      local_27e0._0_4_ = (uint)(bVar33 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar33 & 1) * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 1) & 1);
      local_27e0._4_4_ = (uint)bVar25 * auVar44._4_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 2) & 1);
      local_27e0._8_4_ = (uint)bVar25 * auVar44._8_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 3) & 1);
      local_27e0._12_4_ = (uint)bVar25 * auVar44._12_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 4) & 1);
      local_27e0._16_4_ = (uint)bVar25 * auVar44._16_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 5) & 1);
      local_27e0._20_4_ = (uint)bVar25 * auVar44._20_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar34 >> 6) & 1);
      local_27e0._24_4_ = (uint)bVar25 * auVar44._24_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = SUB81(uVar34 >> 7,0);
      local_27e0._28_4_ = (uint)bVar25 * auVar44._28_4_ | (uint)!bVar25 * -0x800000;
      local_2a44 = (uint)(byte)~bVar33;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar29 = 5;
      }
      else {
        uVar29 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      puVar27 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar30 = (undefined1 (*) [32])local_1e40;
      local_1e60 = local_2800;
      local_2608 = sVar1;
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar101 = ZEXT3264(auVar44);
LAB_01d0d37c:
      do {
        do {
          root.ptr = puVar27[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01d0d93a;
          puVar27 = puVar27 + -1;
          auVar44 = pauVar30[-1];
          auVar102 = ZEXT3264(auVar44);
          pauVar30 = pauVar30 + -1;
          uVar34 = vcmpps_avx512vl(auVar44,local_27e0,1);
        } while ((char)uVar34 == '\0');
        uVar32 = (undefined4)uVar34;
        if (uVar29 < (uint)POPCOUNT(uVar32)) {
LAB_01d0d3c5:
          do {
            lVar28 = 0x1c;
            uVar34 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01d0d93a;
              uVar9 = vcmpps_avx512vl(auVar102._0_32_,local_27e0,9);
              if ((char)uVar9 != '\0') {
                bVar24 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar2 = This->leafIntersector;
                uVar34 = (ulong)(byte)~(byte)local_2a44;
                bVar31 = 0;
                while (uVar34 != 0) {
                  lVar28 = 0;
                  for (uVar26 = uVar34; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000
                      ) {
                    lVar28 = lVar28 + 1;
                  }
                  uVar34 = uVar34 - 1 & uVar34;
                  auVar87 = ZEXT1664(auVar87._0_16_);
                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                  cVar23 = (**(code **)((long)pvVar2 + (ulong)bVar24 * 0x40 + 0x28))
                                     (&local_27c0,ray,lVar28,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  bVar18 = (byte)(1 << ((uint)lVar28 & 0x1f));
                  if (cVar23 == '\0') {
                    bVar18 = 0;
                  }
                  bVar31 = bVar31 | bVar18;
                }
                bVar31 = (byte)local_2a44 | bVar31;
                local_2a44 = (uint)bVar31;
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar97 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar98 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar99 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar100 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar101 = ZEXT3264(auVar44);
                if (bVar31 == 0xff) {
                  local_2a44._0_1_ = 0xff;
                  goto LAB_01d0d93a;
                }
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar25 = (bool)(bVar31 >> 1 & 1);
                bVar3 = (bool)(bVar31 >> 2 & 1);
                bVar4 = (bool)(bVar31 >> 3 & 1);
                bVar5 = (bool)(bVar31 >> 4 & 1);
                bVar6 = (bool)(bVar31 >> 5 & 1);
                bVar7 = (bool)(bVar31 >> 6 & 1);
                local_27e0._4_4_ = (uint)bVar25 * auVar44._4_4_ | (uint)!bVar25 * local_27e0._4_4_;
                local_27e0._0_4_ =
                     (uint)(bVar31 & 1) * auVar44._0_4_ |
                     (uint)!(bool)(bVar31 & 1) * local_27e0._0_4_;
                local_27e0._8_4_ = (uint)bVar3 * auVar44._8_4_ | (uint)!bVar3 * local_27e0._8_4_;
                local_27e0._12_4_ = (uint)bVar4 * auVar44._12_4_ | (uint)!bVar4 * local_27e0._12_4_;
                local_27e0._16_4_ = (uint)bVar5 * auVar44._16_4_ | (uint)!bVar5 * local_27e0._16_4_;
                local_27e0._20_4_ = (uint)bVar6 * auVar44._20_4_ | (uint)!bVar6 * local_27e0._20_4_;
                local_27e0._24_4_ = (uint)bVar7 * auVar44._24_4_ | (uint)!bVar7 * local_27e0._24_4_;
                local_27e0._28_4_ =
                     (uint)(bVar31 >> 7) * auVar44._28_4_ |
                     (uint)!(bool)(bVar31 >> 7) * local_27e0._28_4_;
              }
              goto LAB_01d0d37c;
            }
            uVar26 = root.ptr & 0xfffffffffffffff0;
            auVar44 = auVar100._0_32_;
            for (; (auVar102 = ZEXT3264(auVar44), lVar28 != 0x20 &&
                   (uVar36 = *(ulong *)((uVar26 - 0xe0) + lVar28 * 8), uVar36 != 8));
                lVar28 = lVar28 + 1) {
              auVar102._28_36_ = auVar87._28_36_;
              if ((root.ptr & 7) == 0) {
                uVar32 = *(undefined4 *)((root.ptr - 0x50) + lVar28 * 4);
                auVar70._4_4_ = uVar32;
                auVar70._0_4_ = uVar32;
                auVar70._8_4_ = uVar32;
                auVar70._12_4_ = uVar32;
                auVar70._16_4_ = uVar32;
                auVar70._20_4_ = uVar32;
                auVar70._24_4_ = uVar32;
                auVar70._28_4_ = uVar32;
                auVar72 = vfmsub132ps_fma(auVar70,local_28c0,local_2920);
                uVar32 = *(undefined4 *)((root.ptr - 0x30) + lVar28 * 4);
                auVar82._4_4_ = uVar32;
                auVar82._0_4_ = uVar32;
                auVar82._8_4_ = uVar32;
                auVar82._12_4_ = uVar32;
                auVar82._16_4_ = uVar32;
                auVar82._20_4_ = uVar32;
                auVar82._24_4_ = uVar32;
                auVar82._28_4_ = uVar32;
                auVar69 = vfmsub132ps_fma(auVar82,local_28a0,local_2900);
                uVar32 = *(undefined4 *)((root.ptr - 0x10) + lVar28 * 4);
                auVar86._4_4_ = uVar32;
                auVar86._0_4_ = uVar32;
                auVar86._8_4_ = uVar32;
                auVar86._12_4_ = uVar32;
                auVar86._16_4_ = uVar32;
                auVar86._20_4_ = uVar32;
                auVar86._24_4_ = uVar32;
                auVar86._28_4_ = uVar32;
                uVar32 = *(undefined4 *)((root.ptr - 0x40) + lVar28 * 4);
                auVar10._4_4_ = uVar32;
                auVar10._0_4_ = uVar32;
                auVar10._8_4_ = uVar32;
                auVar10._12_4_ = uVar32;
                auVar10._16_4_ = uVar32;
                auVar10._20_4_ = uVar32;
                auVar10._24_4_ = uVar32;
                auVar10._28_4_ = uVar32;
                auVar43 = vfmsub132ps_avx512vl(local_2920,local_28c0,auVar10);
                uVar32 = *(undefined4 *)((root.ptr - 0x20) + lVar28 * 4);
                auVar11._4_4_ = uVar32;
                auVar11._0_4_ = uVar32;
                auVar11._8_4_ = uVar32;
                auVar11._12_4_ = uVar32;
                auVar11._16_4_ = uVar32;
                auVar11._20_4_ = uVar32;
                auVar11._24_4_ = uVar32;
                auVar11._28_4_ = uVar32;
                auVar40 = vfmsub132ps_avx512vl(local_2900,local_28a0,auVar11);
                auVar81 = vfmsub132ps_fma(auVar86,local_2880,local_28e0);
                uVar32 = *(undefined4 *)(root.ptr + lVar28 * 4);
                auVar12._4_4_ = uVar32;
                auVar12._0_4_ = uVar32;
                auVar12._8_4_ = uVar32;
                auVar12._12_4_ = uVar32;
                auVar12._16_4_ = uVar32;
                auVar12._20_4_ = uVar32;
                auVar12._24_4_ = uVar32;
                auVar12._28_4_ = uVar32;
                auVar45 = vfmsub132ps_avx512vl(local_28e0,local_2880,auVar12);
                auVar41 = vpminsd_avx2(ZEXT1632(auVar72),auVar43);
                auVar42 = vpminsd_avx2(ZEXT1632(auVar69),auVar40);
                auVar41 = vpmaxsd_avx2(auVar41,auVar42);
                auVar42 = vpminsd_avx2(ZEXT1632(auVar81),auVar45);
                auVar41 = vpmaxsd_avx2(auVar41,auVar42);
                auVar42 = vpmaxsd_avx2(ZEXT1632(auVar72),auVar43);
                auVar43 = vpmaxsd_avx2(ZEXT1632(auVar69),auVar40);
                auVar43 = vpminsd_avx2(auVar42,auVar43);
                auVar42 = vpmaxsd_avx2(ZEXT1632(auVar81),auVar45);
                auVar43 = vpminsd_avx2(auVar43,auVar42);
                auVar42 = vpmaxsd_avx2(auVar41,local_2800);
                auVar43 = vpminsd_avx2(auVar43,local_27e0);
                uVar35 = vpcmpd_avx512vl(auVar42,auVar43,2);
              }
              else {
                fVar8 = *(float *)((uVar26 - 0x50) + lVar28 * 4);
                auVar61._4_4_ = fVar8;
                auVar61._0_4_ = fVar8;
                auVar61._8_4_ = fVar8;
                auVar61._12_4_ = fVar8;
                auVar61._16_4_ = fVar8;
                auVar61._20_4_ = fVar8;
                auVar61._24_4_ = fVar8;
                auVar61._28_4_ = fVar8;
                uVar32 = *(undefined4 *)((uVar26 - 0x40) + lVar28 * 4);
                auVar59._4_4_ = uVar32;
                auVar59._0_4_ = uVar32;
                auVar59._8_4_ = uVar32;
                auVar59._12_4_ = uVar32;
                auVar59._16_4_ = uVar32;
                auVar59._20_4_ = uVar32;
                auVar59._24_4_ = uVar32;
                auVar59._28_4_ = uVar32;
                uVar32 = *(undefined4 *)((uVar26 - 0x30) + lVar28 * 4);
                auVar58._4_4_ = uVar32;
                auVar58._0_4_ = uVar32;
                auVar58._8_4_ = uVar32;
                auVar58._12_4_ = uVar32;
                auVar58._16_4_ = uVar32;
                auVar58._20_4_ = uVar32;
                auVar58._24_4_ = uVar32;
                auVar58._28_4_ = uVar32;
                uVar32 = *(undefined4 *)((uVar26 - 0x20) + lVar28 * 4);
                auVar94._4_4_ = uVar32;
                auVar94._0_4_ = uVar32;
                auVar94._8_4_ = uVar32;
                auVar94._12_4_ = uVar32;
                auVar94._16_4_ = uVar32;
                auVar94._20_4_ = uVar32;
                auVar94._24_4_ = uVar32;
                auVar94._28_4_ = uVar32;
                uVar32 = *(undefined4 *)((uVar26 - 0x10) + lVar28 * 4);
                auVar92._4_4_ = uVar32;
                auVar92._0_4_ = uVar32;
                auVar92._8_4_ = uVar32;
                auVar92._12_4_ = uVar32;
                auVar92._16_4_ = uVar32;
                auVar92._20_4_ = uVar32;
                auVar92._24_4_ = uVar32;
                auVar92._28_4_ = uVar32;
                uVar32 = *(undefined4 *)(uVar26 + lVar28 * 4);
                auVar85._4_4_ = uVar32;
                auVar85._0_4_ = uVar32;
                auVar85._8_4_ = uVar32;
                auVar85._12_4_ = uVar32;
                auVar85._16_4_ = uVar32;
                auVar85._20_4_ = uVar32;
                auVar85._24_4_ = uVar32;
                auVar85._28_4_ = uVar32;
                fVar60 = *(float *)(uVar26 + 0x10 + lVar28 * 4);
                auVar83._4_4_ = fVar60;
                auVar83._0_4_ = fVar60;
                auVar83._8_4_ = fVar60;
                auVar83._12_4_ = fVar60;
                auVar83._16_4_ = fVar60;
                auVar83._20_4_ = fVar60;
                auVar83._24_4_ = fVar60;
                auVar83._28_4_ = fVar60;
                fVar62 = *(float *)(uVar26 + 0x20 + lVar28 * 4);
                auVar73._4_4_ = fVar62;
                auVar73._0_4_ = fVar62;
                auVar73._8_4_ = fVar62;
                auVar73._12_4_ = fVar62;
                auVar73._16_4_ = fVar62;
                auVar73._20_4_ = fVar62;
                auVar73._24_4_ = fVar62;
                auVar73._28_4_ = fVar62;
                fVar63 = *(float *)(uVar26 + 0x30 + lVar28 * 4);
                auVar68._4_4_ = fVar63;
                auVar68._0_4_ = fVar63;
                auVar68._8_4_ = fVar63;
                auVar68._12_4_ = fVar63;
                auVar68._16_4_ = fVar63;
                auVar68._20_4_ = fVar63;
                auVar68._24_4_ = fVar63;
                auVar68._28_4_ = fVar63;
                auVar19._4_4_ = local_29e0._4_4_;
                auVar19._0_4_ = local_29e0._0_4_;
                auVar19._8_4_ = local_29e0._8_4_;
                auVar19._12_4_ = local_29e0._12_4_;
                auVar19._16_4_ = local_29e0._16_4_;
                auVar19._20_4_ = local_29e0._20_4_;
                auVar19._24_4_ = local_29e0._24_4_;
                auVar19._28_4_ = local_29e0._28_4_;
                auVar20._4_4_ = local_29e0._36_4_;
                auVar20._0_4_ = local_29e0._32_4_;
                auVar20._8_4_ = local_29e0._40_4_;
                auVar20._12_4_ = local_29e0._44_4_;
                auVar20._16_4_ = local_29e0._48_4_;
                auVar20._20_4_ = local_29e0._52_4_;
                auVar20._24_4_ = local_29e0._56_4_;
                auVar20._28_4_ = local_29e0._60_4_;
                auVar21._4_4_ = local_29e0._68_4_;
                auVar21._0_4_ = local_29e0._64_4_;
                auVar21._8_4_ = local_29e0._72_4_;
                auVar21._12_4_ = local_29e0._76_4_;
                auVar21._16_4_ = local_29e0._80_4_;
                auVar21._20_4_ = local_29e0._84_4_;
                auVar21._24_4_ = local_29e0._88_4_;
                auVar21._28_4_ = local_29e0._92_4_;
                auVar102._0_4_ = (float)local_2940._0_4_ * fVar60;
                auVar102._4_4_ = (float)local_2940._4_4_ * fVar60;
                auVar102._8_4_ = fStack_2938 * fVar60;
                auVar102._12_4_ = fStack_2934 * fVar60;
                auVar102._16_4_ = fStack_2930 * fVar60;
                auVar102._20_4_ = fStack_292c * fVar60;
                auVar102._24_4_ = fStack_2928 * fVar60;
                auVar90._0_4_ = (float)local_2940._0_4_ * fVar62;
                auVar90._4_4_ = (float)local_2940._4_4_ * fVar62;
                auVar90._8_4_ = fStack_2938 * fVar62;
                auVar90._12_4_ = fStack_2934 * fVar62;
                auVar90._16_4_ = fStack_2930 * fVar62;
                auVar90._20_4_ = fStack_292c * fVar62;
                auVar90._28_36_ = in_ZMM9._28_36_;
                auVar90._24_4_ = fStack_2928 * fVar62;
                auVar16._4_4_ = (float)local_2940._4_4_ * fVar63;
                auVar16._0_4_ = (float)local_2940._0_4_ * fVar63;
                auVar16._8_4_ = fStack_2938 * fVar63;
                auVar16._12_4_ = fStack_2934 * fVar63;
                auVar16._16_4_ = fStack_2930 * fVar63;
                auVar16._20_4_ = fStack_292c * fVar63;
                auVar16._24_4_ = fStack_2928 * fVar63;
                auVar16._28_4_ = uStack_2924;
                auVar41 = vfmadd231ps_avx512vl(auVar102._0_32_,local_2960,auVar94);
                auVar42 = vfmadd231ps_avx512vl(auVar90._0_32_,local_2960,auVar92);
                auVar43 = vfmadd231ps_avx512vl(auVar16,auVar85,local_2960);
                auVar81 = vfmadd231ps_fma(auVar41,local_2980,auVar61);
                auVar72 = vfmadd231ps_fma(auVar42,local_2980,auVar59);
                auVar69 = vfmadd231ps_fma(auVar43,auVar58,local_2980);
                auVar41 = auVar97._0_32_;
                vandps_avx512vl(ZEXT1632(auVar81),auVar41);
                auVar42 = auVar98._0_32_;
                uVar35 = vcmpps_avx512vl(auVar43,auVar42,1);
                bVar25 = (bool)((byte)uVar35 & 1);
                iVar37 = auVar98._0_4_;
                auVar47._0_4_ = (uint)bVar25 * iVar37 | (uint)!bVar25 * auVar81._0_4_;
                bVar25 = (bool)((byte)(uVar35 >> 1) & 1);
                iVar51 = auVar98._4_4_;
                auVar47._4_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * auVar81._4_4_;
                bVar25 = (bool)((byte)(uVar35 >> 2) & 1);
                iVar52 = auVar98._8_4_;
                auVar47._8_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * auVar81._8_4_;
                bVar25 = (bool)((byte)(uVar35 >> 3) & 1);
                iVar53 = auVar98._12_4_;
                auVar47._12_4_ = (uint)bVar25 * iVar53 | (uint)!bVar25 * auVar81._12_4_;
                iVar54 = auVar98._16_4_;
                auVar47._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * iVar54;
                iVar55 = auVar98._20_4_;
                auVar47._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * iVar55;
                iVar56 = auVar98._24_4_;
                iVar57 = auVar98._28_4_;
                auVar47._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * iVar56;
                auVar47._28_4_ = (uint)(byte)(uVar35 >> 7) * iVar57;
                vandps_avx512vl(ZEXT1632(auVar72),auVar41);
                uVar35 = vcmpps_avx512vl(auVar47,auVar42,1);
                bVar25 = (bool)((byte)uVar35 & 1);
                auVar48._0_4_ = (uint)bVar25 * iVar37 | (uint)!bVar25 * auVar72._0_4_;
                bVar25 = (bool)((byte)(uVar35 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * auVar72._4_4_;
                bVar25 = (bool)((byte)(uVar35 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * auVar72._8_4_;
                bVar25 = (bool)((byte)(uVar35 >> 3) & 1);
                auVar48._12_4_ = (uint)bVar25 * iVar53 | (uint)!bVar25 * auVar72._12_4_;
                auVar48._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * iVar54;
                auVar48._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * iVar55;
                auVar48._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * iVar56;
                auVar48._28_4_ = (uint)(byte)(uVar35 >> 7) * iVar57;
                vandps_avx512vl(ZEXT1632(auVar69),auVar41);
                uVar35 = vcmpps_avx512vl(auVar48,auVar42,1);
                bVar25 = (bool)((byte)uVar35 & 1);
                auVar49._0_4_ = (uint)bVar25 * iVar37 | (uint)!bVar25 * auVar69._0_4_;
                bVar25 = (bool)((byte)(uVar35 >> 1) & 1);
                auVar49._4_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * auVar69._4_4_;
                bVar25 = (bool)((byte)(uVar35 >> 2) & 1);
                auVar49._8_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * auVar69._8_4_;
                bVar25 = (bool)((byte)(uVar35 >> 3) & 1);
                auVar49._12_4_ = (uint)bVar25 * iVar53 | (uint)!bVar25 * auVar69._12_4_;
                auVar49._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * iVar54;
                auVar49._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * iVar55;
                auVar49._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * iVar56;
                auVar49._28_4_ = (uint)(byte)(uVar35 >> 7) * iVar57;
                auVar41 = vrcp14ps_avx512vl(auVar47);
                auVar43 = auVar99._0_32_;
                auVar42 = vfnmadd213ps_avx512vl(auVar47,auVar41,auVar43);
                auVar81 = vfmadd132ps_fma(auVar42,auVar41,auVar41);
                auVar41 = vrcp14ps_avx512vl(auVar48);
                auVar42 = vfnmadd213ps_avx512vl(auVar48,auVar41,auVar43);
                auVar72 = vfmadd132ps_fma(auVar42,auVar41,auVar41);
                in_ZMM9 = ZEXT1664(auVar72);
                auVar41 = vrcp14ps_avx512vl(auVar49);
                auVar42 = vfnmadd213ps_avx512vl(auVar49,auVar41,auVar43);
                auVar69 = vfmadd132ps_fma(auVar42,auVar41,auVar41);
                auVar45 = auVar101._0_32_;
                auVar41 = vxorps_avx512vl(ZEXT1632(auVar81),auVar45);
                auVar42 = vxorps_avx512vl(ZEXT1632(auVar72),auVar45);
                uVar32 = *(undefined4 *)(uVar26 + 0x40 + lVar28 * 4);
                auVar13._4_4_ = uVar32;
                auVar13._0_4_ = uVar32;
                auVar13._8_4_ = uVar32;
                auVar13._12_4_ = uVar32;
                auVar13._16_4_ = uVar32;
                auVar13._20_4_ = uVar32;
                auVar13._24_4_ = uVar32;
                auVar13._28_4_ = uVar32;
                auVar43 = vfmadd213ps_avx512vl(auVar83,auVar21,auVar13);
                uVar32 = *(undefined4 *)(uVar26 + 0x50 + lVar28 * 4);
                auVar14._4_4_ = uVar32;
                auVar14._0_4_ = uVar32;
                auVar14._8_4_ = uVar32;
                auVar14._12_4_ = uVar32;
                auVar14._16_4_ = uVar32;
                auVar14._20_4_ = uVar32;
                auVar14._24_4_ = uVar32;
                auVar14._28_4_ = uVar32;
                auVar40 = vfmadd213ps_avx512vl(auVar73,auVar21,auVar14);
                auVar45 = vxorps_avx512vl(ZEXT1632(auVar69),auVar45);
                uVar32 = *(undefined4 *)(uVar26 + 0x60 + lVar28 * 4);
                auVar15._4_4_ = uVar32;
                auVar15._0_4_ = uVar32;
                auVar15._8_4_ = uVar32;
                auVar15._12_4_ = uVar32;
                auVar15._16_4_ = uVar32;
                auVar15._20_4_ = uVar32;
                auVar15._24_4_ = uVar32;
                auVar15._28_4_ = uVar32;
                auVar50 = vfmadd213ps_avx512vl(auVar68,auVar21,auVar15);
                auVar38 = vfmadd231ps_fma(auVar43,auVar20,auVar94);
                auVar89 = vfmadd231ps_fma(auVar40,auVar20,auVar92);
                auVar39 = vfmadd231ps_fma(auVar50,auVar20,auVar85);
                auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar19,auVar61);
                fVar60 = auVar41._0_4_ * auVar38._0_4_;
                fVar62 = auVar41._4_4_ * auVar38._4_4_;
                auVar17._4_4_ = fVar62;
                auVar17._0_4_ = fVar60;
                fVar63 = auVar41._8_4_ * auVar38._8_4_;
                auVar17._8_4_ = fVar63;
                fVar64 = auVar41._12_4_ * auVar38._12_4_;
                auVar17._12_4_ = fVar64;
                fVar65 = auVar41._16_4_ * 0.0;
                auVar17._16_4_ = fVar65;
                fVar66 = auVar41._20_4_ * 0.0;
                auVar17._20_4_ = fVar66;
                fVar67 = auVar41._24_4_ * 0.0;
                auVar17._24_4_ = fVar67;
                auVar17._28_4_ = fVar8;
                auVar38 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar19,auVar59);
                auVar43 = vmulps_avx512vl(ZEXT1632(auVar38),auVar42);
                auVar38 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar19,auVar58);
                auVar40 = vmulps_avx512vl(ZEXT1632(auVar38),auVar45);
                auVar71._0_4_ = auVar81._0_4_ + fVar60;
                auVar71._4_4_ = auVar81._4_4_ + fVar62;
                auVar71._8_4_ = auVar81._8_4_ + fVar63;
                auVar71._12_4_ = auVar81._12_4_ + fVar64;
                auVar71._16_4_ = fVar65 + 0.0;
                auVar71._20_4_ = fVar66 + 0.0;
                auVar71._24_4_ = fVar67 + 0.0;
                auVar71._28_4_ = fVar8 + 0.0;
                auVar74._0_4_ = auVar72._0_4_ + auVar43._0_4_;
                auVar74._4_4_ = auVar72._4_4_ + auVar43._4_4_;
                auVar74._8_4_ = auVar72._8_4_ + auVar43._8_4_;
                auVar74._12_4_ = auVar72._12_4_ + auVar43._12_4_;
                auVar74._16_4_ = auVar43._16_4_ + 0.0;
                auVar74._20_4_ = auVar43._20_4_ + 0.0;
                auVar74._24_4_ = auVar43._24_4_ + 0.0;
                auVar74._28_4_ = auVar43._28_4_ + 0.0;
                auVar84._0_4_ = auVar69._0_4_ + auVar40._0_4_;
                auVar84._4_4_ = auVar69._4_4_ + auVar40._4_4_;
                auVar84._8_4_ = auVar69._8_4_ + auVar40._8_4_;
                auVar84._12_4_ = auVar69._12_4_ + auVar40._12_4_;
                auVar84._16_4_ = auVar40._16_4_ + 0.0;
                auVar84._20_4_ = auVar40._20_4_ + 0.0;
                auVar84._24_4_ = auVar40._24_4_ + 0.0;
                auVar84._28_4_ = auVar40._28_4_ + 0.0;
                auVar41 = vpminsd_avx2(auVar17,auVar71);
                auVar42 = vpminsd_avx2(auVar43,auVar74);
                auVar41 = vpmaxsd_avx2(auVar41,auVar42);
                auVar42 = vpminsd_avx2(auVar40,auVar84);
                auVar41 = vpmaxsd_avx2(auVar41,auVar42);
                auVar42 = vpmaxsd_avx2(auVar17,auVar71);
                auVar43 = vpmaxsd_avx2(auVar43,auVar74);
                auVar43 = vpminsd_avx2(auVar42,auVar43);
                auVar42 = vpmaxsd_avx2(auVar40,auVar84);
                auVar43 = vpminsd_avx2(auVar43,auVar42);
                auVar42 = vpmaxsd_avx2(auVar41,local_2800);
                auVar43 = vpminsd_avx2(auVar43,local_27e0);
                uVar35 = vcmpps_avx512vl(auVar42,auVar43,2);
              }
              auVar87 = ZEXT1664(auVar81);
              uVar22 = uVar34;
              auVar46 = auVar44;
              if ((byte)uVar35 != 0) {
                auVar42 = vblendmps_avx512vl(auVar100._0_32_,auVar41);
                bVar25 = (bool)((byte)uVar35 & 1);
                auVar46._0_4_ = (uint)bVar25 * auVar42._0_4_ | (uint)!bVar25 * auVar41._0_4_;
                bVar25 = (bool)((byte)(uVar35 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar25 * auVar42._4_4_ | (uint)!bVar25 * auVar41._4_4_;
                bVar25 = (bool)((byte)(uVar35 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar25 * auVar42._8_4_ | (uint)!bVar25 * auVar41._8_4_;
                bVar25 = (bool)((byte)(uVar35 >> 3) & 1);
                auVar46._12_4_ = (uint)bVar25 * auVar42._12_4_ | (uint)!bVar25 * auVar41._12_4_;
                bVar25 = (bool)((byte)(uVar35 >> 4) & 1);
                auVar46._16_4_ = (uint)bVar25 * auVar42._16_4_ | (uint)!bVar25 * auVar41._16_4_;
                bVar25 = (bool)((byte)(uVar35 >> 5) & 1);
                auVar46._20_4_ = (uint)bVar25 * auVar42._20_4_ | (uint)!bVar25 * auVar41._20_4_;
                bVar25 = (bool)((byte)(uVar35 >> 6) & 1);
                auVar46._24_4_ = (uint)bVar25 * auVar42._24_4_ | (uint)!bVar25 * auVar41._24_4_;
                bVar25 = SUB81(uVar35 >> 7,0);
                auVar46._28_4_ = (uint)bVar25 * auVar42._28_4_ | (uint)!bVar25 * auVar41._28_4_;
                uVar22 = uVar36;
                if (uVar34 != 8) {
                  *puVar27 = uVar34;
                  puVar27 = puVar27 + 1;
                  *pauVar30 = auVar44;
                  pauVar30 = pauVar30 + 1;
                }
              }
              auVar44 = auVar46;
              uVar34 = uVar22;
            }
            if (uVar34 == 8) goto LAB_01d0d702;
            uVar9 = vcmpps_avx512vl(auVar44,local_27e0,9);
            root.ptr = uVar34;
          } while ((byte)uVar29 < (byte)POPCOUNT((int)uVar9));
          *puVar27 = uVar34;
          puVar27 = puVar27 + 1;
          *pauVar30 = auVar44;
          pauVar30 = pauVar30 + 1;
LAB_01d0d702:
          iVar37 = 4;
        }
        else {
          while (bVar24 = (byte)local_2a44, uVar34 != 0) {
            sVar1 = 0;
            for (uVar26 = uVar34; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              sVar1 = sVar1 + 1;
            }
            uVar34 = uVar34 - 1 & uVar34;
            auVar87 = ZEXT1664(auVar87._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            bVar25 = occluded1(This,bvh,root,sVar1,(Precalculations *)&local_27c0,ray,
                               (TravRayK<8,_false> *)&local_29e0.field_0,context);
            bVar31 = (byte)(1 << ((uint)sVar1 & 0x1f));
            if (!bVar25) {
              bVar31 = 0;
            }
            local_2a44 = (uint)(bVar24 | bVar31);
          }
          iVar37 = 3;
          auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar97 = ZEXT3264(auVar41);
          auVar41 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar98 = ZEXT3264(auVar41);
          auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar99 = ZEXT3264(auVar41);
          auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar100 = ZEXT3264(auVar41);
          auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar101 = ZEXT3264(auVar41);
          auVar102 = ZEXT3264(auVar44);
          if (bVar24 != 0xff) {
            auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_27e0._0_4_ =
                 (uint)(bVar24 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar24 & 1) * local_27e0._0_4_;
            bVar25 = (bool)((byte)(local_2a44 >> 1) & 1);
            local_27e0._4_4_ = (uint)bVar25 * auVar44._4_4_ | (uint)!bVar25 * local_27e0._4_4_;
            bVar25 = (bool)((byte)(local_2a44 >> 2) & 1);
            local_27e0._8_4_ = (uint)bVar25 * auVar44._8_4_ | (uint)!bVar25 * local_27e0._8_4_;
            bVar25 = (bool)((byte)(local_2a44 >> 3) & 1);
            local_27e0._12_4_ = (uint)bVar25 * auVar44._12_4_ | (uint)!bVar25 * local_27e0._12_4_;
            bVar25 = (bool)((byte)(local_2a44 >> 4) & 1);
            local_27e0._16_4_ = (uint)bVar25 * auVar44._16_4_ | (uint)!bVar25 * local_27e0._16_4_;
            bVar25 = (bool)((byte)(local_2a44 >> 5) & 1);
            local_27e0._20_4_ = (uint)bVar25 * auVar44._20_4_ | (uint)!bVar25 * local_27e0._20_4_;
            bVar25 = (bool)((byte)(local_2a44 >> 6) & 1);
            local_27e0._24_4_ = (uint)bVar25 * auVar44._24_4_ | (uint)!bVar25 * local_27e0._24_4_;
            local_27e0._28_4_ =
                 (local_2a44 >> 7) * auVar44._28_4_ |
                 (uint)!SUB41(local_2a44 >> 7,0) * local_27e0._28_4_;
            iVar37 = 2;
          }
          if (uVar29 < (uint)POPCOUNT(uVar32)) goto LAB_01d0d3c5;
        }
        if (iVar37 == 3) {
LAB_01d0d93a:
          local_2a44._0_1_ = (byte)local_2a44 & bVar33;
          bVar25 = (bool)((byte)local_2a44 >> 1 & 1);
          bVar3 = (bool)((byte)local_2a44 >> 2 & 1);
          bVar4 = (bool)((byte)local_2a44 >> 3 & 1);
          bVar5 = (bool)((byte)local_2a44 >> 4 & 1);
          bVar6 = (bool)((byte)local_2a44 >> 5 & 1);
          bVar7 = (bool)((byte)local_2a44 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)((byte)local_2a44 & 1) * -0x800000 |
               (uint)!(bool)((byte)local_2a44 & 1) * *(int *)(ray + 0x100);
          *(uint *)(ray + 0x104) = (uint)bVar25 * -0x800000 | (uint)!bVar25 * *(int *)(ray + 0x104);
          *(uint *)(ray + 0x108) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x108);
          *(uint *)(ray + 0x10c) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x10c);
          *(uint *)(ray + 0x110) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x110);
          *(uint *)(ray + 0x114) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x114);
          *(uint *)(ray + 0x118) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x118);
          *(uint *)(ray + 0x11c) =
               (uint)((byte)local_2a44 >> 7) * -0x800000 |
               (uint)!(bool)((byte)local_2a44 >> 7) * *(int *)(ray + 0x11c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }